

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# identification_strategy.cpp
# Opt level: O2

FUNCTION_RETURN __thiscall
license::hw_identifier::IdentificationStrategy::generate_pc_id
          (IdentificationStrategy *this,HwIdentifier *pc_id)

{
  vector<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
  available_ids;
  
  (*this->_vptr_IdentificationStrategy[4])(&available_ids,this);
  if (available_ids.
      super__Vector_base<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      available_ids.
      super__Vector_base<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    *(undefined8 *)(pc_id->m_data)._M_elems =
         *(undefined8 *)
          ((available_ids.
            super__Vector_base<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
            ._M_impl.super__Vector_impl_data._M_start)->m_data)._M_elems;
  }
  std::
  vector<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
  ::~vector(&available_ids);
  return (uint)(available_ids.
                super__Vector_base<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
               available_ids.
               super__Vector_base<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
               ._M_impl.super__Vector_impl_data._M_start);
}

Assistant:

FUNCTION_RETURN IdentificationStrategy::generate_pc_id(HwIdentifier& pc_id) const {
	const vector<HwIdentifier> available_ids = alternative_ids();
	FUNCTION_RETURN result = FUNC_RET_NOT_AVAIL;
	if (available_ids.size() > 0) {
		pc_id = available_ids[0];
		result = FUNC_RET_OK;
	}
	return result;
}